

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcRelFillsElement::~IfcRelFillsElement(IfcRelFillsElement *this)

{
  IfcRoot::~IfcRoot((IfcRoot *)this,&PTR_construction_vtable_24__00777be0);
  return;
}

Assistant:

IfcRelFillsElement() : Object("IfcRelFillsElement") {}